

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(uint64_t *out1,uint8_t *arg1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  byte *in_RSI;
  ulong *in_RDI;
  uint64_t x126;
  uint64_t x125;
  uint64_t x124;
  uint64_t x123;
  uint64_t x122;
  uint64_t x121;
  uint64_t x120;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x119;
  uint64_t x118;
  uint64_t x117;
  uint64_t x116;
  uint64_t x115;
  uint64_t x114;
  uint64_t x113;
  uint64_t x112;
  uint8_t x111;
  uint64_t x110;
  uint64_t x109;
  uint64_t x108;
  uint64_t x107;
  uint64_t x106;
  uint64_t x105;
  uint64_t x104;
  uint64_t x103;
  uint64_t x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  uint64_t x98;
  uint8_t x97;
  uint64_t x96;
  uint64_t x95;
  uint64_t x94;
  uint64_t x93;
  uint64_t x92;
  uint64_t x91;
  uint64_t x90;
  uint8_t x89;
  uint64_t x88;
  uint64_t x87;
  uint64_t x86;
  uint64_t x85;
  uint64_t x84;
  uint64_t x83;
  uint64_t x82;
  uint64_t x81;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x80;
  uint64_t x79;
  uint64_t x78;
  uint64_t x77;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  uint8_t x72;
  uint64_t x71;
  uint64_t x70;
  uint64_t x69;
  uint64_t x68;
  uint64_t x67;
  uint64_t x66;
  uint64_t x65;
  uint8_t x64;
  uint64_t x63;
  uint64_t x62;
  uint64_t x61;
  uint64_t x60;
  uint64_t x59;
  uint64_t x58;
  uint64_t x57;
  uint64_t x56;
  uint64_t x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  uint64_t x35;
  uint64_t x34;
  uint64_t x33;
  uint8_t x32;
  uint64_t x31;
  uint64_t x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  uint64_t x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  uint64_t x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t x142;
  uint64_t x141;
  uint64_t x140;
  uint64_t x139;
  uint64_t x138;
  uint64_t x137;
  uint8_t x136;
  uint64_t x135;
  uint64_t x134;
  uint64_t x133;
  uint64_t x132;
  uint64_t x131;
  uint64_t x130;
  uint64_t x129;
  uint8_t x128;
  uint64_t x127;
  
  bVar1 = in_RSI[0x3f];
  bVar2 = in_RSI[0x3e];
  bVar3 = in_RSI[0x3d];
  bVar4 = in_RSI[0x3c];
  bVar5 = in_RSI[0x3b];
  bVar6 = in_RSI[0x3a];
  bVar7 = in_RSI[0x1f];
  bVar8 = in_RSI[0x1e];
  bVar9 = in_RSI[0x1d];
  bVar10 = in_RSI[0x1c];
  bVar11 = in_RSI[0x1b];
  bVar12 = in_RSI[0x1a];
  uVar13 = ((ulong)in_RSI[6] << 0x30) +
           ((ulong)in_RSI[5] << 0x28) +
           ((ulong)in_RSI[4] << 0x20) +
           (ulong)in_RSI[3] * 0x1000000 +
           (ulong)in_RSI[2] * 0x10000 + (ulong)in_RSI[1] * 0x100 + (ulong)*in_RSI;
  uVar14 = ((ulong)in_RSI[0xc] << 0x2c) +
           ((ulong)in_RSI[0xb] << 0x24) +
           (ulong)in_RSI[10] * 0x10000000 +
           (ulong)in_RSI[9] * 0x100000 +
           (ulong)in_RSI[8] * 0x1000 + (ulong)in_RSI[7] * 0x10 + (uVar13 >> 0x34);
  uVar15 = ((ulong)in_RSI[0x13] << 0x31) +
           ((ulong)in_RSI[0x12] << 0x29) +
           ((ulong)in_RSI[0x11] << 0x21) +
           (ulong)in_RSI[0x10] * 0x2000000 +
           (ulong)in_RSI[0xf] * 0x20000 +
           (ulong)in_RSI[0xe] * 0x200 + (ulong)in_RSI[0xd] * 2 + (uVar14 >> 0x33);
  uVar16 = ((ulong)in_RSI[0x19] << 0x2e) +
           ((ulong)in_RSI[0x18] << 0x26) +
           (ulong)in_RSI[0x17] * 0x40000000 +
           (ulong)in_RSI[0x16] * 0x400000 +
           (ulong)in_RSI[0x15] * 0x4000 + (ulong)in_RSI[0x14] * 0x40 + (uVar15 >> 0x33);
  uVar17 = ((ulong)in_RSI[0x26] << 0x30) +
           ((ulong)in_RSI[0x25] << 0x28) +
           ((ulong)in_RSI[0x24] << 0x20) +
           (ulong)in_RSI[0x23] * 0x1000000 +
           (ulong)in_RSI[0x22] * 0x10000 + (ulong)in_RSI[0x21] * 0x100 + (ulong)in_RSI[0x20];
  uVar18 = ((ulong)in_RSI[0x2c] << 0x2c) +
           ((ulong)in_RSI[0x2b] << 0x24) +
           (ulong)in_RSI[0x2a] * 0x10000000 +
           (ulong)in_RSI[0x29] * 0x100000 +
           (ulong)in_RSI[0x28] * 0x1000 + (ulong)in_RSI[0x27] * 0x10 + (uVar17 >> 0x34);
  uVar19 = ((ulong)in_RSI[0x33] << 0x31) +
           ((ulong)in_RSI[0x32] << 0x29) +
           ((ulong)in_RSI[0x31] << 0x21) +
           (ulong)in_RSI[0x30] * 0x2000000 +
           (ulong)in_RSI[0x2f] * 0x20000 +
           (ulong)in_RSI[0x2e] * 0x200 + (ulong)in_RSI[0x2d] * 2 + (uVar18 >> 0x33);
  uVar20 = ((ulong)in_RSI[0x39] << 0x2e) +
           ((ulong)in_RSI[0x38] << 0x26) +
           (ulong)in_RSI[0x37] * 0x40000000 +
           (ulong)in_RSI[0x36] * 0x400000 +
           (ulong)in_RSI[0x35] * 0x4000 + (ulong)in_RSI[0x34] * 0x40 + (uVar19 >> 0x33);
  *in_RDI = uVar13 & 0xfffffffffffff;
  in_RDI[1] = uVar14 & 0x7ffffffffffff;
  in_RDI[2] = uVar15 & 0x7ffffffffffff;
  in_RDI[3] = uVar16 & 0x7ffffffffffff;
  in_RDI[4] = ((ulong)bVar7 << 0x2b) +
              ((ulong)bVar8 << 0x23) +
              (ulong)bVar9 * 0x8000000 +
              (ulong)bVar10 * 0x80000 + (ulong)bVar11 * 0x800 + (ulong)bVar12 * 8 + (uVar16 >> 0x33)
  ;
  in_RDI[5] = uVar17 & 0xfffffffffffff;
  in_RDI[6] = uVar18 & 0x7ffffffffffff;
  in_RDI[7] = uVar19 & 0x7ffffffffffff;
  in_RDI[8] = uVar20 & 0x7ffffffffffff;
  in_RDI[9] = ((ulong)bVar1 << 0x2b) +
              ((ulong)bVar2 << 0x23) +
              (ulong)bVar3 * 0x8000000 +
              (ulong)bVar4 * 0x80000 + (ulong)bVar5 * 0x800 + (ulong)bVar6 * 8 + (uVar20 >> 0x33);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(
    uint64_t out1[10], const uint8_t arg1[64]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    uint64_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint8_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint8_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    uint64_t x87;
    uint64_t x88;
    uint8_t x89;
    uint64_t x90;
    uint64_t x91;
    uint64_t x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint8_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    uint64_t x109;
    uint64_t x110;
    uint8_t x111;
    uint64_t x112;
    uint64_t x113;
    uint64_t x114;
    uint64_t x115;
    uint64_t x116;
    uint64_t x117;
    uint64_t x118;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint8_t x128;
    uint64_t x129;
    uint64_t x130;
    uint64_t x131;
    uint64_t x132;
    uint64_t x133;
    uint64_t x134;
    uint64_t x135;
    uint8_t x136;
    uint64_t x137;
    uint64_t x138;
    uint64_t x139;
    uint64_t x140;
    uint64_t x141;
    uint64_t x142;
    x1 = ((uint64_t)(arg1[63]) << 43);
    x2 = ((uint64_t)(arg1[62]) << 35);
    x3 = ((uint64_t)(arg1[61]) << 27);
    x4 = ((uint64_t)(arg1[60]) << 19);
    x5 = ((uint64_t)(arg1[59]) << 11);
    x6 = ((uint64_t)(arg1[58]) << 3);
    x7 = ((uint64_t)(arg1[57]) << 46);
    x8 = ((uint64_t)(arg1[56]) << 38);
    x9 = ((uint64_t)(arg1[55]) << 30);
    x10 = ((uint64_t)(arg1[54]) << 22);
    x11 = ((uint64_t)(arg1[53]) << 14);
    x12 = ((uint64_t)(arg1[52]) << 6);
    x13 = ((uint64_t)(arg1[51]) << 49);
    x14 = ((uint64_t)(arg1[50]) << 41);
    x15 = ((uint64_t)(arg1[49]) << 33);
    x16 = ((uint64_t)(arg1[48]) << 25);
    x17 = ((uint64_t)(arg1[47]) << 17);
    x18 = ((uint64_t)(arg1[46]) << 9);
    x19 = ((uint64_t)(arg1[45]) * 0x2);
    x20 = ((uint64_t)(arg1[44]) << 44);
    x21 = ((uint64_t)(arg1[43]) << 36);
    x22 = ((uint64_t)(arg1[42]) << 28);
    x23 = ((uint64_t)(arg1[41]) << 20);
    x24 = ((uint64_t)(arg1[40]) << 12);
    x25 = ((uint64_t)(arg1[39]) << 4);
    x26 = ((uint64_t)(arg1[38]) << 48);
    x27 = ((uint64_t)(arg1[37]) << 40);
    x28 = ((uint64_t)(arg1[36]) << 32);
    x29 = ((uint64_t)(arg1[35]) << 24);
    x30 = ((uint64_t)(arg1[34]) << 16);
    x31 = ((uint64_t)(arg1[33]) << 8);
    x32 = (arg1[32]);
    x33 = ((uint64_t)(arg1[31]) << 43);
    x34 = ((uint64_t)(arg1[30]) << 35);
    x35 = ((uint64_t)(arg1[29]) << 27);
    x36 = ((uint64_t)(arg1[28]) << 19);
    x37 = ((uint64_t)(arg1[27]) << 11);
    x38 = ((uint64_t)(arg1[26]) << 3);
    x39 = ((uint64_t)(arg1[25]) << 46);
    x40 = ((uint64_t)(arg1[24]) << 38);
    x41 = ((uint64_t)(arg1[23]) << 30);
    x42 = ((uint64_t)(arg1[22]) << 22);
    x43 = ((uint64_t)(arg1[21]) << 14);
    x44 = ((uint64_t)(arg1[20]) << 6);
    x45 = ((uint64_t)(arg1[19]) << 49);
    x46 = ((uint64_t)(arg1[18]) << 41);
    x47 = ((uint64_t)(arg1[17]) << 33);
    x48 = ((uint64_t)(arg1[16]) << 25);
    x49 = ((uint64_t)(arg1[15]) << 17);
    x50 = ((uint64_t)(arg1[14]) << 9);
    x51 = ((uint64_t)(arg1[13]) * 0x2);
    x52 = ((uint64_t)(arg1[12]) << 44);
    x53 = ((uint64_t)(arg1[11]) << 36);
    x54 = ((uint64_t)(arg1[10]) << 28);
    x55 = ((uint64_t)(arg1[9]) << 20);
    x56 = ((uint64_t)(arg1[8]) << 12);
    x57 = ((uint64_t)(arg1[7]) << 4);
    x58 = ((uint64_t)(arg1[6]) << 48);
    x59 = ((uint64_t)(arg1[5]) << 40);
    x60 = ((uint64_t)(arg1[4]) << 32);
    x61 = ((uint64_t)(arg1[3]) << 24);
    x62 = ((uint64_t)(arg1[2]) << 16);
    x63 = ((uint64_t)(arg1[1]) << 8);
    x64 = (arg1[0]);
    x65 = (x63 + (uint64_t)x64);
    x66 = (x62 + x65);
    x67 = (x61 + x66);
    x68 = (x60 + x67);
    x69 = (x59 + x68);
    x70 = (x58 + x69);
    x71 = (x70 & UINT64_C(0xfffffffffffff));
    x72 = (uint8_t)(x70 >> 52);
    x73 = (x57 + (uint64_t)x72);
    x74 = (x56 + x73);
    x75 = (x55 + x74);
    x76 = (x54 + x75);
    x77 = (x53 + x76);
    x78 = (x52 + x77);
    x79 = (x78 & UINT64_C(0x7ffffffffffff));
    x80 = (fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1)(x78 >> 51);
    x81 = (x51 + (uint64_t)x80);
    x82 = (x50 + x81);
    x83 = (x49 + x82);
    x84 = (x48 + x83);
    x85 = (x47 + x84);
    x86 = (x46 + x85);
    x87 = (x45 + x86);
    x88 = (x87 & UINT64_C(0x7ffffffffffff));
    x89 = (uint8_t)(x87 >> 51);
    x90 = (x44 + (uint64_t)x89);
    x91 = (x43 + x90);
    x92 = (x42 + x91);
    x93 = (x41 + x92);
    x94 = (x40 + x93);
    x95 = (x39 + x94);
    x96 = (x95 & UINT64_C(0x7ffffffffffff));
    x97 = (uint8_t)(x95 >> 51);
    x98 = (x38 + (uint64_t)x97);
    x99 = (x37 + x98);
    x100 = (x36 + x99);
    x101 = (x35 + x100);
    x102 = (x34 + x101);
    x103 = (x33 + x102);
    x104 = (x31 + (uint64_t)x32);
    x105 = (x30 + x104);
    x106 = (x29 + x105);
    x107 = (x28 + x106);
    x108 = (x27 + x107);
    x109 = (x26 + x108);
    x110 = (x109 & UINT64_C(0xfffffffffffff));
    x111 = (uint8_t)(x109 >> 52);
    x112 = (x25 + (uint64_t)x111);
    x113 = (x24 + x112);
    x114 = (x23 + x113);
    x115 = (x22 + x114);
    x116 = (x21 + x115);
    x117 = (x20 + x116);
    x118 = (x117 & UINT64_C(0x7ffffffffffff));
    x119 = (fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1)(x117 >> 51);
    x120 = (x19 + (uint64_t)x119);
    x121 = (x18 + x120);
    x122 = (x17 + x121);
    x123 = (x16 + x122);
    x124 = (x15 + x123);
    x125 = (x14 + x124);
    x126 = (x13 + x125);
    x127 = (x126 & UINT64_C(0x7ffffffffffff));
    x128 = (uint8_t)(x126 >> 51);
    x129 = (x12 + (uint64_t)x128);
    x130 = (x11 + x129);
    x131 = (x10 + x130);
    x132 = (x9 + x131);
    x133 = (x8 + x132);
    x134 = (x7 + x133);
    x135 = (x134 & UINT64_C(0x7ffffffffffff));
    x136 = (uint8_t)(x134 >> 51);
    x137 = (x6 + (uint64_t)x136);
    x138 = (x5 + x137);
    x139 = (x4 + x138);
    x140 = (x3 + x139);
    x141 = (x2 + x140);
    x142 = (x1 + x141);
    out1[0] = x71;
    out1[1] = x79;
    out1[2] = x88;
    out1[3] = x96;
    out1[4] = x103;
    out1[5] = x110;
    out1[6] = x118;
    out1[7] = x127;
    out1[8] = x135;
    out1[9] = x142;
}